

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_client.cpp
# Opt level: O2

int __thiscall zmq::plain_client_t::process_handshake_command(plain_client_t *this,msg_t *msg_)

{
  int iVar1;
  int iVar2;
  EVP_PKEY_CTX *ctx;
  size_t data_size_;
  socket_base_t *this_00;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  int *piVar3;
  char *pcVar4;
  EVP_PKEY_CTX *cmd_data_;
  
  cmd_data_ = (EVP_PKEY_CTX *)msg_;
  ctx = (EVP_PKEY_CTX *)msg_t::data(msg_);
  data_size_ = msg_t::size(msg_);
  if (data_size_ < 8) {
    if (5 < data_size_) goto LAB_001d0bfb;
    if (data_size_ == 5) goto LAB_001d0c27;
LAB_001d0c3d:
    this_00 = session_base_t::get_socket((this->super_mechanism_base_t).session);
    endpoint_uri_pair_ = session_base_t::get_endpoint((this->super_mechanism_base_t).session);
    socket_base_t::event_handshake_failed_protocol(this_00,endpoint_uri_pair_,0x10000001);
    piVar3 = __errno_location();
    *piVar3 = 0x47;
    iVar1 = -1;
  }
  else {
    if (*(long *)ctx == 0x454d4f434c455707) {
      iVar1 = process_welcome(this,(uchar *)cmd_data_,data_size_);
      ctx = cmd_data_;
    }
    else {
LAB_001d0bfb:
      iVar1 = bcmp(ctx,&ready_prefix,6);
      if (iVar1 == 0) {
        iVar1 = process_ready(this,(uchar *)ctx,data_size_);
      }
      else {
LAB_001d0c27:
        iVar1 = bcmp(ctx,"^RROR",5);
        if (iVar1 != 0) goto LAB_001d0c3d;
        iVar1 = process_error(this,(uchar *)ctx,data_size_);
      }
    }
    if (iVar1 == 0) {
      iVar1 = msg_t::close(msg_,(int)ctx);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        ctx = (EVP_PKEY_CTX *)0x1dfbd5;
        fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
                ,0x62);
        fflush(_stderr);
        zmq_abort(pcVar4);
      }
      iVar2 = msg_t::init(msg_,ctx);
      iVar1 = 0;
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
                ,100);
        fflush(_stderr);
        zmq_abort(pcVar4);
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int zmq::plain_client_t::process_handshake_command (msg_t *msg_)
{
    const unsigned char *cmd_data =
      static_cast<unsigned char *> (msg_->data ());
    const size_t data_size = msg_->size ();

    int rc = 0;
    if (data_size >= welcome_prefix_len
        && !memcmp (cmd_data, welcome_prefix, welcome_prefix_len))
        rc = process_welcome (cmd_data, data_size);
    else if (data_size >= ready_prefix_len
             && !memcmp (cmd_data, ready_prefix, ready_prefix_len))
        rc = process_ready (cmd_data, data_size);
    else if (data_size >= error_prefix_len
             && !memcmp (cmd_data, error_prefix, error_prefix_len))
        rc = process_error (cmd_data, data_size);
    else {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNEXPECTED_COMMAND);
        errno = EPROTO;
        rc = -1;
    }

    if (rc == 0) {
        rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
    }

    return rc;
}